

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string_view value,Arena *arena)

{
  bool bVar1;
  string *psVar2;
  const_pointer pvVar3;
  char *extraout_RDX;
  string_view value_00;
  string_view s;
  void *local_38;
  ScopedCheckPtrInvariants local_29;
  anon_unknown_8 *paStack_28;
  ScopedCheckPtrInvariants check;
  Arena *arena_local;
  ArenaStringPtr *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (ArenaStringPtr *)value._M_len;
  paStack_28 = (anon_unknown_8 *)arena;
  anon_unknown_8::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants(&local_29,&this->tagged_ptr_);
  bVar1 = IsDefault(this);
  if (bVar1) {
    if (paStack_28 == (anon_unknown_8 *)0x0) {
      value_00._M_str = extraout_RDX;
      value_00._M_len = value_local._M_len;
      local_38 = (void *)anon_unknown_8::CreateString((anon_unknown_8 *)this_local,value_00);
    }
    else {
      s._M_str = (char *)arena;
      s._M_len = value_local._M_len;
      local_38 = (void *)anon_unknown_8::CreateArenaString(paStack_28,(Arena *)this_local,s);
    }
    (this->tagged_ptr_).ptr_ = local_38;
  }
  else {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::basic_string_view<char,_std::char_traits<char>_>::length
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::__cxx11::string::assign((char *)psVar2,(ulong)pvVar3);
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(absl::string_view value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value.data(), value.length());
    }
  }
}